

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O3

void R_InitSprites(void)

{
  TArray<int,_int> *this;
  BYTE BVar1;
  BYTE BVar2;
  PClassPlayerPawn *pPVar3;
  double dVar4;
  double dVar5;
  size_t sVar6;
  FString __src;
  int iVar7;
  FPlayerSkin *pFVar8;
  spritedef_t *psVar9;
  uint uVar10;
  BYTE *pBVar11;
  char *palname;
  ulong uVar12;
  ulong uVar13;
  FString classface;
  int lastlump;
  FString local_40;
  int local_34;
  
  palname = "SPALDOOM";
  if (gameinfo.gametype == GAME_DoomChex) {
    palname = "SPALHTIC";
  }
  R_CreateSkinTranslation(palname);
  numskins = (size_t)PlayerClasses.Count;
  local_34 = 0;
  iVar7 = FWadCollection::FindLump(&Wads,"S_SKIN",&local_34,true);
  if (iVar7 != -1) {
    do {
      numskins = numskins + 1;
      iVar7 = FWadCollection::FindLump(&Wads,"S_SKIN",&local_34,true);
    } while (iVar7 != -1);
  }
  if (skins != (FPlayerSkin *)0x0) {
    operator_delete__(skins);
  }
  sVar6 = numskins;
  uVar13 = numskins << 6;
  pFVar8 = (FPlayerSkin *)operator_new__(-(ulong)(numskins >> 0x3a != 0) | uVar13);
  skins = pFVar8;
  memset(pFVar8,0,uVar13);
  if (sVar6 != 0) {
    pPVar3 = (PlayerClasses.Array)->Type;
    BVar1 = pPVar3->ColorRangeStart;
    BVar2 = pPVar3->ColorRangeEnd;
    pBVar11 = (pPVar3->super_PClassActor).super_PClass.Defaults;
    dVar4 = *(double *)(pBVar11 + 0xd8);
    dVar5 = *(double *)(pBVar11 + 0xe0);
    pBVar11 = &pFVar8->range0start;
    uVar10 = 1;
    do {
      *pBVar11 = BVar1;
      pBVar11[1] = BVar2;
      ((DVector2 *)(pBVar11 + 10))->X = dVar4;
      *(double *)(pBVar11 + 0x12) = dVar5;
      uVar13 = (ulong)uVar10;
      pBVar11 = pBVar11 + 0x40;
      uVar10 = uVar10 + 1;
    } while (uVar13 < sVar6);
  }
  R_InitSpriteDefs();
  R_InitVoxels();
  NumStdSprites = sprites.Count;
  R_InitSkins();
  if (PlayerClasses.Count != 0) {
    uVar13 = 0;
    do {
      pPVar3 = PlayerClasses.Array[uVar13].Type;
      FString::AttachToOther(&local_40,&pPVar3->Face);
      __src.Chars = local_40.Chars;
      pFVar8 = skins;
      skins[uVar13].name[4] = '\0';
      builtin_strncpy(pFVar8[uVar13].name,"Base",4);
      if ((*(int *)(local_40.Chars + -0xc) == 0) ||
         (iVar7 = strcmp(local_40.Chars,"None"), iVar7 == 0)) {
        skins[uVar13].face[0] = 'S';
        skins[uVar13].face[1] = 'T';
        skins[uVar13].face[2] = 'F';
        skins[uVar13].face[3] = '\0';
      }
      else {
        strcpy(skins[uVar13].face,__src.Chars);
      }
      pFVar8 = skins;
      skins[uVar13].range0start = pPVar3->ColorRangeStart;
      pFVar8[uVar13].range0end = pPVar3->ColorRangeEnd;
      pBVar11 = (pPVar3->super_PClassActor).super_PClass.Defaults;
      dVar4 = *(double *)(pBVar11 + 0xe0);
      pFVar8[uVar13].Scale.X = *(double *)(pBVar11 + 0xd8);
      pFVar8[uVar13].Scale.Y = dVar4;
      pFVar8[uVar13].sprite = (uint)*(ushort *)(*(long *)(pBVar11 + 0x408) + 0x10);
      pFVar8[uVar13].namespc = 0;
      this = &PlayerClasses.Array[uVar13].Skins;
      TArray<int,_int>::Grow(this,1);
      this->Array[this->Count] = (int)uVar13;
      this->Count = this->Count + 1;
      if ((sprites.Array[skins[uVar13].sprite].field_0.dwName == 0x59414c50) &&
         ((ulong)sprites.Count != 0)) {
        uVar12 = 0;
        psVar9 = sprites.Array;
        do {
          if ((psVar9->field_0).dwName == deh.PlayerSprite._0_4_) {
            skins[uVar13].sprite = (int)uVar12;
            break;
          }
          uVar12 = uVar12 + 1;
          psVar9 = psVar9 + 1;
        } while (sprites.Count != uVar12);
      }
      FString::~FString(&local_40);
      uVar13 = uVar13 + 1;
    } while (uVar13 < PlayerClasses.Count);
  }
  gl_InitModels();
  return;
}

Assistant:

void R_InitSprites ()
{
	int lump, lastlump;
	unsigned int i, j;

	// [RH] Create a standard translation to map skins between Heretic and Doom
	if (gameinfo.gametype == GAME_DoomChex)
	{
		R_CreateSkinTranslation ("SPALHTIC");
	}
	else
	{
		R_CreateSkinTranslation ("SPALDOOM");
	}

	// [RH] Count the number of skins.
	numskins = PlayerClasses.Size ();
	lastlump = 0;
	while ((lump = Wads.FindLump ("S_SKIN", &lastlump, true)) != -1)
	{
		numskins++;
	}

	// [RH] Do some preliminary setup
	if (skins != NULL) delete [] skins;
	skins = new FPlayerSkin[numskins];
	memset (skins, 0, sizeof(*skins) * numskins);
	for (i = 0; i < numskins; i++)
	{ // Assume Doom skin by default
		PClassPlayerPawn *type = PlayerClasses[0].Type;
		skins[i].range0start = type->ColorRangeStart;
		skins[i].range0end = type->ColorRangeEnd;
		skins[i].Scale = GetDefaultByType (type)->Scale;
	}

	R_InitSpriteDefs ();
	R_InitVoxels();		// [RH] Parse VOXELDEF
	NumStdSprites = sprites.Size();
	R_InitSkins ();		// [RH] Finish loading skin data

	// [RH] Set up base skin
	// [GRB] Each player class has its own base skin
	for (i = 0; i < PlayerClasses.Size (); i++)
	{
		PClassPlayerPawn *basetype = PlayerClasses[i].Type;
		FString classface = basetype->Face;

		strcpy (skins[i].name, "Base");
		if (classface.IsEmpty() || strcmp(classface, "None") == 0)
		{
			skins[i].face[0] = 'S';
			skins[i].face[1] = 'T';
			skins[i].face[2] = 'F';
			skins[i].face[3] = '\0';
		}
		else
		{
			strcpy(skins[i].face, classface);
		}
		skins[i].range0start = basetype->ColorRangeStart;
		skins[i].range0end = basetype->ColorRangeEnd;
		skins[i].Scale = GetDefaultByType (basetype)->Scale;
		skins[i].sprite = GetDefaultByType (basetype)->SpawnState->sprite;
		skins[i].namespc = ns_global;

		PlayerClasses[i].Skins.Push (i);

		if (memcmp (sprites[skins[i].sprite].name, "PLAY", 4) == 0)
		{
			for (j = 0; j < sprites.Size (); j++)
			{
				if (memcmp (sprites[j].name, deh.PlayerSprite, 4) == 0)
				{
					skins[i].sprite = (int)j;
					break;
				}
			}
		}
	}

	// [RH] Sort the skins, but leave base as skin 0
	//qsort (&skins[PlayerClasses.Size ()], numskins-PlayerClasses.Size (), sizeof(FPlayerSkin), skinsorter);

	gl_InitModels();
}